

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_archive_string.c
# Opt level: O3

void test_archive_string_sort(void)

{
  uint uVar1;
  int iVar2;
  time_t tVar3;
  char **strings;
  char *pcVar4;
  long lVar5;
  long lVar6;
  char **ppcVar7;
  ulong uVar8;
  
  lVar6 = 0;
  tVar3 = time((time_t *)0x0);
  srand((uint)tVar3);
  strings = (char **)calloc(1,0xe0);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string.c"
                   ,L'Ɓ',(uint)(strings != (char **)0x0),
                   "(test_strings = (char **)calloc(1, sizeof(strings))) != NULL",(void *)0x0);
  do {
    pcVar4 = strdup(*(char **)((long)::strings + lVar6));
    *(char **)((long)strings + lVar6) = pcVar4;
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string.c"
                     ,L'ƃ',(uint)(pcVar4 != (char *)0x0),
                     "(test_strings[i] = strdup(strings[i])) != NULL",(void *)0x0);
    lVar6 = lVar6 + 8;
  } while (lVar6 != 0xd8);
  lVar6 = -0x1b;
  uVar8 = 0x1b;
  ppcVar7 = strings;
  do {
    uVar1 = rand();
    pcVar4 = *ppcVar7;
    lVar5 = (uVar1 / uVar8) * lVar6 + (ulong)uVar1;
    *ppcVar7 = ppcVar7[lVar5];
    ppcVar7[lVar5] = pcVar4;
    ppcVar7 = ppcVar7 + 1;
    lVar6 = lVar6 + 1;
    uVar8 = uVar8 - 1;
  } while (uVar8 != 0);
  iVar2 = archive_utility_string_sort(strings);
  lVar6 = 0;
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L'Ɛ',0,"ARCHIVE_OK",(long)iVar2,"archive_utility_string_sort(test_strings)",
                      (void *)0x0);
  do {
    assertion_equal_string
              ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string.c"
               ,L'ƒ',*(char **)((long)strings + lVar6),"test_strings[i]",
               *(char **)((long)::strings + lVar6),"strings[i]",(void *)0x0,L'\0');
    lVar6 = lVar6 + 8;
  } while (lVar6 != 0xd8);
  lVar6 = 0;
  do {
    free(strings[lVar6]);
    lVar6 = lVar6 + 1;
  } while (lVar6 != 0x1b);
  free(strings);
  return;
}

Assistant:

DEFINE_TEST(test_archive_string_sort)
{
  unsigned int i, j, size;
  char **test_strings, *tmp;

  srand(time(NULL));
  size = sizeof(strings) / sizeof(char *);
  assert((test_strings = (char **)calloc(1, sizeof(strings))) != NULL);
  for (i = 0; i < (size - 1); i++)
    assert((test_strings[i] = strdup(strings[i])) != NULL);

  /* Shuffle the test strings */
  for (i = 0; i < (size - 1); i++)
  {
    j = rand() % ((size - 1) - i);
    j += i;
    tmp = test_strings[i];
    test_strings[i] = test_strings[j];
    test_strings[j] = tmp;
  }

  /* Sort and test */
  assertEqualInt(ARCHIVE_OK, archive_utility_string_sort(test_strings));
  for (i = 0; i < (size - 1); i++)
    assertEqualString(test_strings[i], strings[i]);

  for (i = 0; i < (size - 1); i++)
    free(test_strings[i]);
  free(test_strings);
}